

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

DockPosition __thiscall QToolBarAreaLayout::findToolBar(QToolBarAreaLayout *this,QToolBar *toolBar)

{
  int iVar1;
  QList<QToolBarAreaLayoutLine> *this_00;
  qsizetype qVar2;
  const_reference pQVar3;
  const_reference pQVar4;
  undefined4 extraout_var;
  long in_RSI;
  long in_RDI;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  QToolBarAreaLayoutInfo *dock;
  int i;
  long in_stack_ffffffffffffffa8;
  int local_3c;
  int local_2c;
  DockPosition local_1c;
  
  local_1c = LeftDock;
  do {
    if (3 < (int)local_1c) {
      return DockCount;
    }
    local_2c = 0;
    while( true ) {
      this_00 = (QList<QToolBarAreaLayoutLine> *)(long)local_2c;
      qVar2 = QList<QToolBarAreaLayoutLine>::size
                        ((QList<QToolBarAreaLayoutLine> *)
                         (in_RDI + 0x18 + (long)(int)local_1c * 0x38));
      if (qVar2 <= (long)this_00) break;
      pQVar3 = QList<QToolBarAreaLayoutLine>::at(this_00,in_stack_ffffffffffffffa8);
      local_3c = 0;
      while( true ) {
        in_stack_ffffffffffffffa8 = (long)local_3c;
        qVar2 = QList<QToolBarAreaLayoutItem>::size(&pQVar3->toolBarItems);
        if (qVar2 <= in_stack_ffffffffffffffa8) break;
        pQVar4 = QList<QToolBarAreaLayoutItem>::at
                           ((QList<QToolBarAreaLayoutItem> *)this_00,in_stack_ffffffffffffffa8);
        iVar1 = (*pQVar4->widgetItem->_vptr_QLayoutItem[0xd])();
        if (CONCAT44(extraout_var,iVar1) == in_RSI) {
          return local_1c;
        }
        local_3c = local_3c + 1;
      }
      local_2c = local_2c + 1;
    }
    local_1c = local_1c + RightDock;
  } while( true );
}

Assistant:

QInternal::DockPosition QToolBarAreaLayout::findToolBar(const QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar)
                    return static_cast<QInternal::DockPosition>(i);
            }
        }
    }

    return QInternal::DockCount;
}